

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineCatmullRom(Vector2 *points,int pointCount,float thick,Color color)

{
  Vector2 VVar1;
  Vector2 VVar2;
  Vector2 VVar3;
  Vector2 VVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  float radius;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector2 vertices [50];
  Vector2 local_208;
  Vector2 local_1f8;
  undefined8 uStack_1f0;
  Vector2 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [98];
  
  if (3 < pointCount) {
    local_208 = points[1];
    memset(local_1b8,0,0x180);
    radius = thick * 0.5;
    DrawCircleV(local_208,radius,color);
    local_1f8.x = 0.0;
    local_1f8.y = 0.0;
    uStack_1f0 = 0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    uVar7 = 0;
    while (uVar7 != pointCount - 3) {
      if (uVar7 != 0) {
        local_1f8.y = -fVar12 * fVar11 + local_208.y;
        local_1f8.x = fVar11 * fVar13 + local_208.x;
        uStack_1f0 = CONCAT44(fVar11 * fVar12 + local_208.y,-fVar13 * fVar11 + local_208.x);
      }
      VVar1 = points[uVar7];
      VVar2 = points[uVar7 + 1];
      VVar3 = points[uVar7 + 2];
      VVar4 = points[uVar7 + 3];
      iVar5 = 1;
      for (lVar6 = 0x10; lVar6 != 400; lVar6 = lVar6 + 0x10) {
        fVar13 = (float)iVar5 / 24.0;
        fVar11 = fVar13 * fVar13 * fVar13;
        fVar12 = ((fVar13 + fVar13) * fVar13 - fVar11) - fVar13;
        fVar10 = fVar13 * -3.0 * fVar13 * fVar13 + fVar13 * 4.0 * fVar13 + fVar13;
        fVar9 = fVar13 * 3.0 * fVar13 * fVar13 + fVar13 * -5.0 * fVar13 + 2.0;
        fVar11 = fVar11 - fVar13 * fVar13;
        fVar8 = (fVar11 * VVar4.x + fVar10 * VVar3.x + fVar12 * VVar1.x + fVar9 * VVar2.x) * 0.5;
        fVar9 = (fVar11 * VVar4.y + fVar10 * VVar3.y + fVar12 * VVar1.y + fVar9 * VVar2.y) * 0.5;
        fVar12 = fVar8 - local_208.x;
        fVar13 = fVar9 - local_208.y;
        fVar11 = radius / SQRT(fVar12 * fVar12 + fVar13 * fVar13);
        if (lVar6 == 0x10 && uVar7 == 0) {
          local_1f8.y = -fVar12 * fVar11 + local_208.y;
          local_1f8.x = fVar13 * fVar11 + local_208.x;
          uStack_1f0 = CONCAT44(fVar11 * fVar12 + local_208.y,-fVar13 * fVar11 + local_208.x);
        }
        *(float *)((long)&local_1c8.x + lVar6) = fVar11 * fVar13 + fVar8;
        *(float *)((long)&local_1c8.y + lVar6) = fVar11 * -fVar12 + fVar9;
        *(float *)((long)local_1b8 + lVar6 + -8) = fVar11 * -fVar13 + fVar8;
        *(float *)((long)local_1b8 + lVar6 + -4) = fVar11 * fVar12 + fVar9;
        iVar5 = iVar5 + 1;
        local_208.x = fVar8;
        local_208.y = fVar9;
      }
      local_1c8 = local_1f8;
      uStack_1c0 = uStack_1f0;
      DrawTriangleStrip(&local_1c8,0x32,color);
      uVar7 = uVar7 + 1;
    }
    DrawCircleV(local_208,radius,color);
  }
  return;
}

Assistant:

void DrawSplineCatmullRom(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 4) return;

    float dy = 0.0f;
    float dx = 0.0f;
    float size = 0.0f;

    Vector2 currentPoint = points[1];
    Vector2 nextPoint = { 0 };
    Vector2 vertices[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    DrawCircleV(currentPoint, thick/2.0f, color);   // Draw init line circle-cap

    for (int i = 0; i < (pointCount - 3); i++)
    {
        float t = 0.0f;
        Vector2 p1 = points[i], p2 = points[i + 1], p3 = points[i + 2], p4 = points[i + 3];

        if (i > 0)
        {
            vertices[0].x = currentPoint.x + dy*size;
            vertices[0].y = currentPoint.y - dx*size;
            vertices[1].x = currentPoint.x - dy*size;
            vertices[1].y = currentPoint.y + dx*size;
        }

        for (int j = 1; j <= SPLINE_SEGMENT_DIVISIONS; j++)
        {
            t = ((float)j)/((float)SPLINE_SEGMENT_DIVISIONS);

            float q0 = (-1.0f*t*t*t) + (2.0f*t*t) + (-1.0f*t);
            float q1 = (3.0f*t*t*t) + (-5.0f*t*t) + 2.0f;
            float q2 = (-3.0f*t*t*t) + (4.0f*t*t) + t;
            float q3 = t*t*t - t*t;

            nextPoint.x = 0.5f*((p1.x*q0) + (p2.x*q1) + (p3.x*q2) + (p4.x*q3));
            nextPoint.y = 0.5f*((p1.y*q0) + (p2.y*q1) + (p3.y*q2) + (p4.y*q3));

            dy = nextPoint.y - currentPoint.y;
            dx = nextPoint.x - currentPoint.x;
            size = (0.5f*thick)/sqrtf(dx*dx + dy*dy);

            if ((i == 0) && (j == 1))
            {
                vertices[0].x = currentPoint.x + dy*size;
                vertices[0].y = currentPoint.y - dx*size;
                vertices[1].x = currentPoint.x - dy*size;
                vertices[1].y = currentPoint.y + dx*size;
            }

            vertices[2*j + 1].x = nextPoint.x - dy*size;
            vertices[2*j + 1].y = nextPoint.y + dx*size;
            vertices[2*j].x = nextPoint.x + dy*size;
            vertices[2*j].y = nextPoint.y - dx*size;

            currentPoint = nextPoint;
        }

        DrawTriangleStrip(vertices, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
    }

    // Cap circle drawing at the end of every segment
    DrawCircleV(currentPoint, thick/2.0f, color);
}